

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O3

void textui_get_panel(int *min_y,int *min_x,int *max_y,int *max_x)

{
  term *ptVar1;
  term *ptVar2;
  
  ptVar2 = angband_term[0];
  if (angband_term[0] != (term *)0x0) {
    *min_y = angband_term[0]->offset_y;
    *min_x = ptVar2->offset_x;
    ptVar1 = Term;
    *max_y = (Term->hgt - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode])) /
             (int)(uint)tile_height + ptVar2->offset_y;
    *max_x = (~col_map[ptVar1->sidebar_mode] + ptVar1->wid) / (int)(uint)tile_width +
             ptVar2->offset_x;
  }
  return;
}

Assistant:

void textui_get_panel(int *min_y, int *min_x, int *max_y, int *max_x)
{
	term *t = term_screen;

	if (!t) return;

	*min_y = t->offset_y;
	*min_x = t->offset_x;
	*max_y = t->offset_y + SCREEN_HGT;
	*max_x = t->offset_x + SCREEN_WID;
}